

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O1

ion_sl_node_t * sl_find_node(ion_skiplist_t *skiplist,ion_key_t key)

{
  ion_key_size_t iVar1;
  bool bVar2;
  char cVar3;
  long lVar4;
  sl_node ***pppsVar5;
  ion_sl_node_t *piVar6;
  
  piVar6 = skiplist->head;
  if (-1 < (long)piVar6->height) {
    iVar1 = (skiplist->super).record.key_size;
    lVar4 = (long)piVar6->height;
    do {
      if (piVar6->next[lVar4] != (sl_node *)0x0) {
        cVar3 = (*(skiplist->super).compare)(piVar6->next[lVar4]->key,key,iVar1);
        while (cVar3 < '\x01') {
          pppsVar5 = &piVar6->next;
          if (((*pppsVar5)[lVar4] != (sl_node *)0x0) &&
             (cVar3 = (*(skiplist->super).compare)((*pppsVar5)[lVar4]->key,key,iVar1), cVar3 == '\0'
             )) {
            return (*pppsVar5)[lVar4];
          }
          piVar6 = (*pppsVar5)[lVar4];
          if (piVar6->next[lVar4] == (sl_node *)0x0) break;
          cVar3 = (*(skiplist->super).compare)(piVar6->next[lVar4]->key,key,iVar1);
        }
      }
      bVar2 = 0 < lVar4;
      lVar4 = lVar4 + -1;
    } while (bVar2);
  }
  return piVar6;
}

Assistant:

ion_sl_node_t *
sl_find_node(
	ion_skiplist_t	*skiplist,
	ion_key_t		key
) {
	int				key_size	= skiplist->super.record.key_size;
	ion_sl_node_t	*cursor		= skiplist->head;
	ion_sl_level_t	h;

	for (h = skiplist->head->height; h >= 0; h--) {
		while (NULL != cursor->next[h] && skiplist->super.compare(cursor->next[h]->key, key, key_size) <= 0) {
			if ((NULL != cursor->next[h]) && (skiplist->super.compare(cursor->next[h]->key, key, key_size) == 0)) {
				return cursor->next[h];
			}

			cursor = cursor->next[h];
		}
	}

	/* Key was not found, so return closest thing to that key */
	return cursor;
}